

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O2

void BasicTests::brandaoTest(string *input_file)

{
  time_t tVar1;
  string savename;
  long local_50;
  long local_48;
  string local_30;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  std::__cxx11::string::string((string *)&local_50,(string *)input_file);
  std::__cxx11::string::erase((string *)&local_50,local_50,local_50 + 7);
  std::__cxx11::string::erase((ulong)&local_50,local_48 - 2);
  std::__cxx11::string::string((string *)&local_30,(string *)&local_50);
  Capacitor_Test_GA(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void BasicTests::brandaoTest(string input_file) {
    srand(time(NULL));

    string savename = input_file;
    savename.erase(savename.begin(), savename.begin() + 7);
    savename.erase(savename.length() - 2, savename.length() - 1);

//    testeEntradas(savename);//perda total e tensao minima para cada configuration para compara com a tese do leonardo willer

//    Capacitor_Test_Ivo(savename);
    Capacitor_Test_GA(savename);
}